

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_writer_create_local_dir_header
                  (mz_zip_archive *pZip,mz_uint8 *pDst,mz_uint16 filename_size,mz_uint16 extra_size,
                  mz_uint64 uncomp_size,mz_uint64 comp_size,mz_uint32 uncomp_crc32,mz_uint16 method,
                  mz_uint16 bit_flags,mz_uint16 dos_time,mz_uint16 dos_date)

{
  undefined1 uVar1;
  undefined2 in_CX;
  undefined2 in_DX;
  undefined1 *in_RSI;
  ulong in_R8;
  ulong in_R9;
  undefined4 in_stack_00000008;
  short in_stack_00000010;
  undefined2 in_stack_00000018;
  ulong local_f8;
  ulong local_e8;
  
  memset(in_RSI,0,0x1e);
  *in_RSI = 0x50;
  in_RSI[1] = 0x4b;
  in_RSI[2] = 3;
  in_RSI[3] = 4;
  uVar1 = 0;
  if (in_stack_00000010 != 0) {
    uVar1 = 0x14;
  }
  in_RSI[4] = uVar1;
  in_RSI[5] = 0;
  in_RSI[6] = (char)in_stack_00000018;
  in_RSI[7] = (char)((ushort)in_stack_00000018 >> 8);
  in_RSI[8] = (char)in_stack_00000010;
  in_RSI[9] = (char)((ushort)in_stack_00000010 >> 8);
  in_RSI[10] = (char)comp_size;
  in_RSI[0xb] = (char)(comp_size >> 8);
  in_RSI[0xc] = (char)uncomp_size;
  in_RSI[0xd] = (char)(uncomp_size >> 8);
  in_RSI[0xe] = (char)in_stack_00000008;
  in_RSI[0xf] = (char)((uint)in_stack_00000008 >> 8);
  in_RSI[0x10] = (char)((uint)in_stack_00000008 >> 0x10);
  in_RSI[0x11] = (char)((uint)in_stack_00000008 >> 0x18);
  local_e8 = in_R9;
  if (0xfffffffe < in_R9) {
    local_e8 = 0xffffffff;
  }
  in_RSI[0x12] = (char)local_e8;
  in_RSI[0x13] = (char)(local_e8 >> 8);
  in_RSI[0x14] = (char)(local_e8 >> 0x10);
  in_RSI[0x15] = (char)(local_e8 >> 0x18);
  local_f8 = in_R8;
  if (0xfffffffe < in_R8) {
    local_f8 = 0xffffffff;
  }
  in_RSI[0x16] = (char)local_f8;
  in_RSI[0x17] = (char)(local_f8 >> 8);
  in_RSI[0x18] = (char)(local_f8 >> 0x10);
  in_RSI[0x19] = (char)(local_f8 >> 0x18);
  in_RSI[0x1a] = (char)in_DX;
  in_RSI[0x1b] = (char)((ushort)in_DX >> 8);
  in_RSI[0x1c] = (char)in_CX;
  in_RSI[0x1d] = (char)((ushort)in_CX >> 8);
  return 1;
}

Assistant:

static mz_bool mz_zip_writer_create_local_dir_header(
    mz_zip_archive *pZip, mz_uint8 *pDst, mz_uint16 filename_size,
    mz_uint16 extra_size, mz_uint64 uncomp_size, mz_uint64 comp_size,
    mz_uint32 uncomp_crc32, mz_uint16 method, mz_uint16 bit_flags,
    mz_uint16 dos_time, mz_uint16 dos_date) {
  (void)pZip;
  memset(pDst, 0, MZ_ZIP_LOCAL_DIR_HEADER_SIZE);
  MZ_WRITE_LE32(pDst + MZ_ZIP_LDH_SIG_OFS, MZ_ZIP_LOCAL_DIR_HEADER_SIG);
  MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_VERSION_NEEDED_OFS, method ? 20 : 0);
  MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_BIT_FLAG_OFS, bit_flags);
  MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_METHOD_OFS, method);
  MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_FILE_TIME_OFS, dos_time);
  MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_FILE_DATE_OFS, dos_date);
  MZ_WRITE_LE32(pDst + MZ_ZIP_LDH_CRC32_OFS, uncomp_crc32);
  MZ_WRITE_LE32(pDst + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS,
                MZ_MIN(comp_size, MZ_UINT32_MAX));
  MZ_WRITE_LE32(pDst + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS,
                MZ_MIN(uncomp_size, MZ_UINT32_MAX));
  MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_FILENAME_LEN_OFS, filename_size);
  MZ_WRITE_LE16(pDst + MZ_ZIP_LDH_EXTRA_LEN_OFS, extra_size);
  return MZ_TRUE;
}